

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

FT_Error ps_mask_ensure(PS_Mask mask,FT_UInt count,FT_Memory memory)

{
  uint uVar1;
  FT_Byte *pFVar2;
  uint uVar3;
  FT_Error error;
  FT_Error local_1c;
  
  uVar1 = mask->max_bits >> 3;
  uVar3 = count + 7 >> 3;
  local_1c = 0;
  if (uVar1 < uVar3) {
    uVar3 = uVar3 + 7 & 0xfffffff8;
    pFVar2 = (FT_Byte *)ft_mem_realloc(memory,1,(ulong)uVar1,(ulong)uVar3,mask->bytes,&local_1c);
    mask->bytes = pFVar2;
    if (local_1c == 0) {
      mask->max_bits = uVar3 << 3;
    }
  }
  return local_1c;
}

Assistant:

static FT_Error
  ps_mask_ensure( PS_Mask    mask,
                  FT_UInt    count,
                  FT_Memory  memory )
  {
    FT_UInt   old_max = mask->max_bits >> 3;
    FT_UInt   new_max = ( count + 7 ) >> 3;
    FT_Error  error   = FT_Err_Ok;


    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 8 );
      /* added bytes are zeroed here */
      if ( !FT_RENEW_ARRAY( mask->bytes, old_max, new_max ) )
        mask->max_bits = new_max * 8;
    }
    return error;
  }